

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DifferentialTest.h
# Opt level: O0

void DiffTestRecurse<Blob<128>,Blob<224>>
               (pfHash hash,Blob<128> *k1,Blob<128> *k2,Blob<224> *h1,Blob<224> *h2,int start,
               int bitsleft,vector<Blob<128>,_std::allocator<Blob<128>_>_> *diffs)

{
  bool bVar1;
  int iVar2;
  Blob<224> *in_RCX;
  Blob<128> *in_RDX;
  pfHash in_RSI;
  code *in_RDI;
  Blob<224> *in_R8;
  uint32_t in_R9D;
  int unaff_retaddr;
  int in_stack_00000008;
  undefined4 in_stack_0000000c;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> *in_stack_00000010;
  int i;
  int bits;
  int in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> *in_stack_ffffffffffffffa0;
  Blob<128> *in_stack_ffffffffffffffb8;
  undefined4 uVar3;
  uint32_t uVar4;
  
  uVar3 = 0x80;
  uVar4 = in_R9D;
  for (; (int)in_R9D < 0x80; in_R9D = in_R9D + 1) {
    flipbit(in_RDX,0x10,in_R9D);
    iVar2 = in_stack_00000008 + -1;
    (*in_RDI)(in_RDX,0x10,0,in_R8);
    bVar1 = Blob<224>::operator==(in_RCX,in_R8);
    if (bVar1) {
      Blob<128>::operator^(in_stack_ffffffffffffffb8,(Blob<128> *)in_stack_00000010);
      std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::push_back
                (in_stack_ffffffffffffffa0,
                 (value_type *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    }
    if (iVar2 != 0) {
      in_stack_ffffffffffffffa0 = in_stack_00000010;
      DiffTestRecurse<Blob<128>,Blob<224>>
                (in_RSI,in_RDX,(Blob<128> *)in_RCX,in_R8,(Blob<224> *)CONCAT44(uVar4,uVar3),in_R9D,
                 unaff_retaddr,
                 (vector<Blob<128>,_std::allocator<Blob<128>_>_> *)CONCAT44(in_stack_0000000c,iVar2)
                );
      in_stack_ffffffffffffff98 = iVar2;
    }
    flipbit(in_RDX,0x10,in_R9D);
  }
  return;
}

Assistant:

void DiffTestRecurse ( pfHash hash, keytype & k1, keytype & k2, hashtype & h1, hashtype & h2, int start, int bitsleft, std::vector<keytype> & diffs )
{
  const int bits = sizeof(keytype)*8;

  for(int i = start; i < bits; i++)
  {
    flipbit(&k2,sizeof(k2),i);
    bitsleft--;

    hash(&k2,sizeof(k2),0,&h2);

    if(h1 == h2)
    {
      diffs.push_back(k1 ^ k2);
    }

    if(bitsleft)
    {
      DiffTestRecurse(hash,k1,k2,h1,h2,i+1,bitsleft,diffs);
    }

    flipbit(&k2,sizeof(k2),i);
    bitsleft++;
  }
}